

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  char *pcVar1;
  pointer pcVar2;
  size_t __n;
  string *psVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  undefined1 *puVar7;
  string local_pname;
  undefined1 local_131;
  char *local_130;
  long local_128;
  char local_120 [8];
  undefined8 uStack_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  long local_108;
  char local_100 [8];
  undefined8 uStack_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  char *local_d0;
  long local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (name->_M_string_length < 3) {
    if ((name->_M_string_length != 2) || (*(name->_M_dataplus)._M_p != '-')) goto LAB_0014d1ab;
LAB_0014d165:
    ::std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
    bVar4 = check_sname(this,&local_70);
    psVar3 = &local_70;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    if (*pcVar1 != '-') {
LAB_0014d1ab:
      pcVar2 = (this->pname_)._M_dataplus._M_p;
      local_90 = local_80;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (this->pname_)._M_string_length);
      if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
        local_f0._M_current = local_e0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_90,local_90 + local_88);
        local_131 = 0x5f;
        _Var6 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_f0,local_f0._M_current + local_e8,
                           (_Iter_equals_val<const_char>)&local_131);
        local_128 = (long)_Var6._M_current - (long)local_f0._M_current;
        *_Var6._M_current = '\0';
        if (local_f0._M_current == local_e0) {
          uStack_118 = uStack_d8;
          local_130 = local_120;
        }
        else {
          local_130 = local_f0._M_current;
        }
        local_e8 = 0;
        local_e0[0] = '\0';
        local_f0._M_current = local_e0;
        ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_130);
        if (local_130 != local_120) {
          operator_delete(local_130);
        }
        if (local_f0._M_current != local_e0) {
          operator_delete(local_f0._M_current);
        }
        pcVar2 = (name->_M_dataplus)._M_p;
        local_110._M_current = local_100;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + name->_M_string_length);
        local_131 = 0x5f;
        _Var6 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_110,local_110._M_current + local_108,
                           (_Iter_equals_val<const_char>)&local_131);
        local_128 = (long)_Var6._M_current - (long)local_110._M_current;
        *_Var6._M_current = '\0';
        if (local_110._M_current == local_100) {
          uStack_118 = uStack_f8;
          local_130 = local_120;
        }
        else {
          local_130 = local_110._M_current;
        }
        local_108 = 0;
        local_100[0] = '\0';
        local_110._M_current = local_100;
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_130);
        if (local_130 != local_120) {
          operator_delete(local_130);
        }
        if (local_110._M_current != local_100) {
          operator_delete(local_110._M_current);
        }
      }
      if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
        local_b0 = local_a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_90,local_90 + local_88);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_b0,local_b0 + local_a8,local_b0);
        if (local_b0 == local_a0) {
          uStack_118 = uStack_98;
          local_130 = local_120;
        }
        else {
          local_130 = local_b0;
        }
        local_128 = local_a8;
        local_a8 = 0;
        local_a0[0] = '\0';
        local_b0 = local_a0;
        ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_130);
        if (local_130 != local_120) {
          operator_delete(local_130);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        pcVar2 = (name->_M_dataplus)._M_p;
        local_d0 = local_c0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + name->_M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_d0,local_d0 + local_c8,local_d0);
        if (local_d0 == local_c0) {
          uStack_118 = uStack_b8;
          local_130 = local_120;
        }
        else {
          local_130 = local_d0;
        }
        local_128 = local_c8;
        local_c8 = 0;
        local_c0[0] = '\0';
        local_d0 = local_c0;
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_130);
        if (local_130 != local_120) {
          operator_delete(local_130);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
      }
      puVar7 = local_90;
      __n = name->_M_string_length;
      if (__n == local_88) {
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp((name->_M_dataplus)._M_p,local_90,__n);
          bVar4 = iVar5 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (puVar7 == local_80) {
        return bVar4;
      }
      goto LAB_0014d52a;
    }
    if (pcVar1[1] != '-') goto LAB_0014d165;
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
    bVar4 = check_lname(this,&local_50);
    psVar3 = &local_50;
  }
  puVar7 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7 == &psVar3->field_2) {
    return bVar4;
  }
LAB_0014d52a:
  operator_delete(puVar7);
  return bVar4;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name[0] == '-' && name[1] == '-')
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.front() == '-')
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_underscore_) {
                local_pname = detail::remove_underscore(local_pname);
                name = detail::remove_underscore(name);
            }
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }